

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

void __thiscall cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,Transaction *transaction)

{
  Transaction *in_RDX;
  uint in_ESI;
  Psbt *in_RDI;
  
  cfd::core::Psbt::Psbt(in_RDI,in_ESI,in_RDX);
  *(undefined ***)in_RDI = &PTR__Psbt_0057e368;
  std::
  set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>::
  set((set<cfd::core::OutPoint,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
       *)0x3c2356);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const Transaction& transaction)
    : cfd::core::Psbt(psbt_version, transaction) {}